

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlElementType xVar1;
  xmlRelaxNGGrammarPtr_conflict pxVar2;
  xmlDocPtr pxVar3;
  int iVar4;
  int iVar5;
  xmlRelaxNGValidStatePtr pxVar6;
  xmlNodePtr pxVar7;
  xmlRelaxNGStatesPtr pxVar8;
  xmlGenericErrorFunc *pp_Var9;
  xmlRelaxNGValidCtxtPtr pxVar10;
  xmlDocPtr pxVar11;
  long lVar12;
  bool bVar13;
  xmlValidCtxt local_a8;
  
  if (doc == (xmlDocPtr)0x0 || ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    return -1;
  }
  ctxt->doc = doc;
  iVar4 = -1;
  if (ctxt->schema == (xmlRelaxNGPtr)0x0) goto LAB_00182de8;
  ctxt->errNo = 0;
  pxVar2 = ctxt->schema->topgrammar;
  if (pxVar2 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
    xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOGRAMMAR,(xmlChar *)0x0,(xmlChar *)0x0,0);
    goto LAB_00182de8;
  }
  pxVar6 = xmlRelaxNGNewValidState(ctxt,(xmlNodePtr)0x0);
  ctxt->state = pxVar6;
  iVar4 = xmlRelaxNGValidateDefinition(ctxt,pxVar2->start);
  if ((ctxt->state == (xmlRelaxNGValidStatePtr)0x0) || (pxVar6->seq == (xmlNodePtr)0x0)) {
    pxVar8 = ctxt->states;
    if (pxVar8 != (xmlRelaxNGStatesPtr)0x0) {
      if (pxVar8->nbState < 1) {
        bVar13 = true;
      }
      else {
        iVar5 = -1;
        lVar12 = 0;
        do {
          pxVar6 = pxVar8->tabState[lVar12];
          pxVar7 = xmlRelaxNGSkipIgnored(ctxt,pxVar6->seq);
          if (pxVar7 == (xmlNodePtr)0x0) {
            iVar5 = 0;
          }
          xmlRelaxNGFreeValidState(ctxt,pxVar6);
          lVar12 = lVar12 + 1;
          pxVar8 = ctxt->states;
        } while (lVar12 < pxVar8->nbState);
        bVar13 = iVar5 == -1;
      }
      if (bVar13) goto LAB_00182d07;
    }
  }
  else {
    pxVar7 = xmlRelaxNGSkipIgnored(ctxt,ctxt->state->seq);
    if (pxVar7 != (xmlNodePtr)0x0) {
LAB_00182d07:
      if (iVar4 != -1) {
        xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_EXTRADATA,(xmlChar *)0x0,(xmlChar *)0x0,0);
        iVar4 = -1;
      }
    }
  }
  if (ctxt->state != (xmlRelaxNGValidStatePtr)0x0) {
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  if (iVar4 != 0) {
    xmlRelaxNGDumpValidError(ctxt);
  }
  if (ctxt->idref == 1) {
    local_a8.vstate = (xmlValidState *)0x0;
    local_a8.am = (xmlAutomataPtr)0x0;
    local_a8.state = (xmlAutomataStatePtr)0x0;
    local_a8.vstateNr = 0;
    local_a8.vstateMax = 0;
    local_a8.vstateTab = (xmlValidState *)0x0;
    local_a8.flags = 0;
    local_a8._52_4_ = 0;
    local_a8.doc = (xmlDocPtr)0x0;
    local_a8.nodeNr = 0;
    local_a8.nodeMax = 0;
    local_a8.nodeTab = (xmlNodePtr *)0x0;
    local_a8.warning = (xmlValidityWarningFunc)0x0;
    local_a8.node = (xmlNodePtr)0x0;
    local_a8.userData = (void *)0x0;
    local_a8.error = (xmlValidityErrorFunc)0x0;
    local_a8.valid = 1;
    local_a8._68_4_ = 0;
    if (ctxt->error == (xmlGenericErrorFunc)0x0) {
      pp_Var9 = __xmlGenericError();
      local_a8.error = *pp_Var9;
      pp_Var9 = __xmlGenericError();
      local_a8.warning = *pp_Var9;
      pxVar10 = (xmlRelaxNGValidCtxtPtr)__xmlGenericErrorContext();
    }
    else {
      local_a8.warning = ctxt->warning;
      pxVar10 = ctxt;
      local_a8.error = ctxt->error;
    }
    local_a8.userData = pxVar10->userData;
    iVar5 = xmlValidateDocumentFinal(&local_a8,doc);
    if (iVar5 != 1) {
      iVar4 = -1;
    }
  }
  if (iVar4 == 0) {
    iVar4 = -(uint)(ctxt->errNo != 0);
  }
LAB_00182de8:
  xVar1 = doc->type;
  if ((xVar1 != XML_HTML_DOCUMENT_NODE) && (xVar1 != XML_DOCUMENT_NODE)) {
    if (xVar1 != XML_ELEMENT_NODE) {
LAB_00182e4e:
      iVar5 = 1;
      if (iVar4 != -1) {
        iVar5 = iVar4;
      }
      return iVar5;
    }
    doc->version = (xmlChar *)0x0;
  }
  pxVar3 = (xmlDocPtr)doc->children;
joined_r0x00182e09:
  pxVar11 = pxVar3;
  if (pxVar11 != (xmlDocPtr)0x0) {
    if (pxVar11->type == XML_ELEMENT_NODE) goto code_r0x00182e11;
    goto LAB_00182e2c;
  }
  goto LAB_00182e4e;
code_r0x00182e11:
  pxVar11->version = (xmlChar *)0x0;
  pxVar3 = (xmlDocPtr)pxVar11->children;
  if ((xmlDocPtr)pxVar11->children == (xmlDocPtr)0x0) {
LAB_00182e2c:
    do {
      pxVar3 = (xmlDocPtr)pxVar11->next;
      if ((xmlDocPtr)pxVar11->next != (xmlDocPtr)0x0) break;
      pxVar11 = (xmlDocPtr)pxVar11->parent;
      if (pxVar11 == (xmlDocPtr)0x0) {
        pxVar3 = (xmlDocPtr)0x0;
        break;
      }
      pxVar3 = (xmlDocPtr)0x0;
    } while (pxVar11 != doc);
  }
  goto joined_r0x00182e09;
}

Assistant:

int
xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt, xmlDocPtr doc)
{
    int ret;

    if ((ctxt == NULL) || (doc == NULL))
        return (-1);

    ctxt->doc = doc;

    ret = xmlRelaxNGValidateDocument(ctxt, doc);
    /*
     * Remove all left PSVI
     */
    xmlRelaxNGCleanPSVI((xmlNodePtr) doc);

    /*
     * TODO: build error codes
     */
    if (ret == -1)
        return (1);
    return (ret);
}